

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::ComputeIncludes_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  string *lang;
  string *config;
  cmValue cVar1;
  string *includes_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string INCLUDE_DIRECTORIES;
  cmGeneratorExpressionInterpreter genexInterpreter;
  allocator<char> local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  cmGeneratorExpressionInterpreter local_a0;
  
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = lg->Makefile;
  lang = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_BUILD_TYPE",(allocator<char> *)&local_120);
  config = cmMakefile::GetSafeDefinition(this_00,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,(string *)config);
  std::__cxx11::string::string((string *)&local_e0,(string *)lang);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_a0,lg,&local_c0,target,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"INCLUDE_DIRECTORIES",&local_139);
  cVar1 = cmSourceFile::GetProperty(source,&local_120);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_100,(string *)cVar1.Value);
    includes_list = cmGeneratorExpressionInterpreter::Evaluate(&local_a0,&local_100,&local_120);
    cmLocalGenerator::AppendIncludeDirectories(lg,&local_138,includes_list,source);
    std::__cxx11::string::~string((string *)&local_100);
  }
  cmLocalGenerator::GetIncludeDirectories(lg,&local_138,target,lang,config);
  cmLocalGenerator::GetIncludeFlags(__return_storage_ptr__,lg,&local_138,target,lang,config,false);
  std::__cxx11::string::~string((string *)&local_120);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter(&local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeIncludes(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::vector<std::string> includes;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetOrDetermineLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, target,
                                                    language);

  // Add include directories for this source file
  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (cmValue cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    lg->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(*cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  // Add include directory flags.
  lg->GetIncludeDirectories(includes, target, language, config);

  std::string includesString =
    lg->GetIncludeFlags(includes, target, language, config, false);

  return includesString;
}